

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

bool __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::valueIndexForOuterAndInnerIndices
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t outerIndex,
          size_t innerIndex,size_t *valueIndex)

{
  bool bVar1;
  const_reference pvVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  difference_type dVar3;
  reference piVar4;
  difference_type *in_RCX;
  long in_RDX;
  size_type in_RSI;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  const_iterator foundIndex;
  const_iterator innerVectorBegin;
  int outerEnd;
  int outerBegin;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff98;
  unsigned_long *in_stack_ffffffffffffffa8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int *local_38;
  int local_30;
  value_type local_2c;
  difference_type *local_28;
  long local_20;
  size_type local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),in_RSI);
  local_2c = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),local_18 + 1);
  local_30 = *pvVar2;
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  *local_28 = (long)local_2c;
  if (local_30 != local_2c) {
    __first = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(in_stack_ffffffffffffff98._M_current,(difference_type)in_RDI);
    __last = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator+(in_stack_ffffffffffffff98._M_current,(difference_type)in_RDI);
    local_40 = std::
               lower_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_long>
                         (__first,__last,in_stack_ffffffffffffffa8);
    dVar3 = std::
            distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                      (local_40,in_stack_ffffffffffffff98);
    *local_28 = dVar3;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff98._M_current,(difference_type)in_RDI);
    bVar1 = __gnu_cxx::operator==
                      (in_RDI,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff88);
    if (((!bVar1) &&
        (piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&local_40), -1 < *piVar4)) &&
       (piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_40), *piVar4 == local_20)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SparseMatrix<ordering>::valueIndexForOuterAndInnerIndices(std::size_t outerIndex, std::size_t innerIndex, std::size_t& valueIndex) const
    {
        //We can use std::lower_bound to between rowNZIndex and rowNZIndex + rowNNZ
        //They are already sorted. The only critical point is if we have -1 in the matrix
        //Which right now it does not apply
        int outerBegin = m_outerStarts[outerIndex];
        int outerEnd = m_outerStarts[outerIndex + 1];
        std::vector<int>::const_iterator innerVectorBegin = m_innerIndices.begin();

        //initialize the return value to be the first element of the row
        valueIndex = outerBegin;
        if (outerEnd - outerBegin == 0) {
            //empty block, avoid searching
            return false;
        }

        std::vector<int>::const_iterator foundIndex = std::lower_bound(innerVectorBegin + outerBegin,
                                                                       innerVectorBegin + outerEnd, innerIndex);

        //Compute the index of the first element next or equal to the one we
        //were looking for

        valueIndex = std::distance(innerVectorBegin, foundIndex);
        if (foundIndex == innerVectorBegin + outerEnd) {
            //not found
            //return the index of the last element of the row
            //as we have to put the element as last element
            return false;
        }

        if (*foundIndex >= 0
            && static_cast<std::size_t>(*foundIndex) == innerIndex) {
            //found
            return true;
        }

        return false;
    }